

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O0

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::enc::ToCaseFolded,axl::enc::Utf8Decoder>::EncodingEmitter_s>
          (Utf8Dfa *this,EncodingEmitter_s *emitter,utf8_t *p)

{
  EncodingEmitter_u *this_00;
  int *in_RDI;
  
  this_00 = (EncodingEmitter_u *)(ulong)(*in_RDI - 0x10);
  switch(this_00) {
  case (EncodingEmitter_u *)0x0:
  case (EncodingEmitter_u *)0x8:
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
    break;
  case (EncodingEmitter_u *)0x10:
  case (EncodingEmitter_u *)0x18:
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
    break;
  case (EncodingEmitter_u *)0x20:
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
    break;
  case (EncodingEmitter_u *)0x30:
  case (EncodingEmitter_u *)0x38:
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
    break;
  case (EncodingEmitter_u *)0x40:
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
    break;
  case (EncodingEmitter_u *)0x50:
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>::
    EncodingEmitter_u::emitCu(this_00,(SrcUnit *)in_RDI,0);
  }
  return;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}